

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  stbi__uint32 a_00;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined8 *puVar10;
  void *pvVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  undefined1 auVar21 [12];
  
  s = z->s;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (10 < CONCAT11(sVar1,sVar2)) {
    sVar3 = stbi__get8(s);
    if (sVar3 != '\b') {
      puVar10 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar12 = "JPEG format not supported: 8-bit only";
      goto LAB_001c9f43;
    }
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    s->img_y = (uint)CONCAT11(sVar3,sVar4);
    if (CONCAT11(sVar3,sVar4) == 0) {
      puVar10 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar12 = "JPEG format not supported: delayed height";
      goto LAB_001c9f43;
    }
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    s->img_x = (uint)CONCAT11(sVar3,sVar4);
    if (CONCAT11(sVar3,sVar4) != 0) {
      if (0x1000000 < s->img_y) {
        puVar10 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
        pcVar12 = "Very large image (corrupt?)";
        goto LAB_001c9f43;
      }
      bVar5 = stbi__get8(s);
      if ((bVar5 < 5) && ((0x1aU >> (bVar5 & 0x1f) & 1) != 0)) {
        s->img_n = (uint)bVar5;
        if (bVar5 != 0) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)&z->img_comp[0].data + lVar14) = 0;
            *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar14) = 0;
            lVar14 = lVar14 + 0x60;
          } while ((ulong)bVar5 * 0x60 != lVar14);
        }
        if (CONCAT11(sVar1,sVar2) == (ushort)((ushort)bVar5 + (ushort)bVar5 * 2 + 8)) {
          z->rgb = 0;
          uVar19 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            piVar16 = &z->img_comp[0].tq;
            lVar14 = 0;
            do {
              bVar5 = stbi__get8(s);
              ((anon_struct_96_18_0d0905d3 *)(piVar16 + -3))->id = (uint)bVar5;
              if ((s->img_n == 3) && (bVar5 == "RGB"[lVar14])) {
                z->rgb = z->rgb + 1;
              }
              bVar5 = stbi__get8(s);
              piVar16[-2] = (uint)(bVar5 >> 4);
              if (((byte)(bVar5 + 0xb0) < 0xc0) ||
                 (piVar16[-1] = bVar5 & 0xf, (bVar5 & 0xf) - 5 < 0xfffffffc)) goto LAB_001c9e91;
              bVar5 = stbi__get8(s);
              *piVar16 = (uint)bVar5;
              if (3 < bVar5) goto LAB_001c9e91;
              lVar14 = lVar14 + 1;
              uVar19 = (ulong)s->img_n;
              piVar16 = piVar16 + 0x18;
            } while (lVar14 < (long)uVar19);
          }
          if (scan != 0) {
            return 1;
          }
          a_00 = s->img_x;
          b_00 = s->img_y;
          iVar9 = (int)uVar19;
          iVar6 = stbi__mad3sizes_valid(a_00,b_00,iVar9,0);
          if (iVar6 == 0) {
            puVar10 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
            *puVar10 = "Image too large to decode";
            return 0;
          }
          if (iVar9 < 1) {
            uVar18 = 1;
            uVar13 = 1;
          }
          else {
            uVar13 = 1;
            lVar14 = 0;
            uVar18 = 1;
            do {
              uVar7 = *(uint *)((long)&z->img_comp[0].h + lVar14);
              uVar8 = *(uint *)((long)&z->img_comp[0].v + lVar14);
              if ((int)uVar18 < (int)uVar7) {
                uVar18 = (ulong)uVar7;
              }
              if ((int)uVar13 < (int)uVar8) {
                uVar13 = (ulong)uVar8;
              }
              lVar14 = lVar14 + 0x60;
            } while ((uVar19 & 0xffffffff) * 0x60 != lVar14);
          }
          iVar17 = (int)uVar18;
          iVar6 = (int)uVar13;
          if (0 < iVar9) {
            lVar14 = 0;
            do {
              if ((iVar17 % *(int *)((long)&z->img_comp[0].h + lVar14) != 0) ||
                 (iVar6 % *(int *)((long)&z->img_comp[0].v + lVar14) != 0)) goto LAB_001c9e91;
              lVar14 = lVar14 + 0x60;
            } while ((uVar19 & 0xffffffff) * 0x60 != lVar14);
          }
          z->img_h_max = iVar17;
          z->img_v_max = iVar6;
          z->img_mcu_w = iVar17 * 8;
          z->img_mcu_h = iVar6 * 8;
          uVar7 = ((a_00 + iVar17 * 8) - 1) / (uint)(iVar17 * 8);
          z->img_mcu_x = uVar7;
          uVar8 = ((b_00 + iVar6 * 8) - 1) / (uint)(iVar6 * 8);
          z->img_mcu_y = uVar8;
          if (iVar9 < 1) {
            return 1;
          }
          iVar9 = 1;
          lVar14 = 0;
          while( true ) {
            iVar15 = *(int *)((long)&z->img_comp[0].h + lVar14);
            iVar20 = *(int *)((long)&z->img_comp[0].v + lVar14);
            *(int *)((long)&z->img_comp[0].x + lVar14) =
                 (int)((iVar15 * a_00 + iVar17 + -1) / uVar18);
            *(int *)((long)&z->img_comp[0].y + lVar14) =
                 (int)((iVar20 * b_00 + iVar6 + -1) / uVar13);
            iVar15 = iVar15 * uVar7;
            a = iVar15 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar14) = a;
            iVar20 = iVar20 * uVar8;
            b = iVar20 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar14) = b;
            pvVar11 = stbi__malloc_mad2(a,b,0xf);
            puVar10 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar14);
            *puVar10 = 0;
            puVar10[1] = 0;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar14) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar14) = pvVar11;
            if (pvVar11 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar14) =
                 (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar14) = iVar15;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar14) = iVar20;
              pvVar11 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar14) = pvVar11;
              if (pvVar11 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar14) =
                   (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            }
            iVar9 = iVar9 + 1;
            lVar14 = lVar14 + 0x60;
            if ((uVar19 & 0xffffffff) * 0x60 == lVar14) {
              return 1;
            }
          }
          auVar21 = __tls_get_addr(&PTR_001f4f18);
          *auVar21._0_8_ = "Out of memory";
          stbi__free_jpeg_components(z,iVar9,auVar21._8_4_);
          return 0;
        }
      }
    }
  }
LAB_001c9e91:
  puVar10 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
  pcVar12 = "Corrupt JPEG";
LAB_001c9f43:
  *puVar10 = pcVar12;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}